

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherInotify.cpp
# Opt level: O0

void __thiscall
efsw::FileWatcherInotify::checkForNewWatcher(FileWatcherInotify *this,Watcher *watch,string *fpath)

{
  bool bVar1;
  bool bVar2;
  __type _Var3;
  pointer ppVar4;
  WatcherInotify *iWatch;
  _Self local_38;
  iterator it;
  Lock lock;
  bool found;
  string *fpath_local;
  Watcher *watch_local;
  FileWatcherInotify *this_local;
  
  FileSystem::dirAddSlashAtEnd(fpath);
  if (((watch->Recursive & 1U) != 0) && (bVar1 = FileSystem::isDirectory(fpath), bVar1)) {
    bVar1 = false;
    Lock::Lock((Lock *)&it,&this->mWatchesLock);
    local_38._M_node =
         (_Base_ptr)
         std::
         map<long,_efsw::WatcherInotify_*,_std::less<long>,_std::allocator<std::pair<const_long,_efsw::WatcherInotify_*>_>_>
         ::begin(&this->mWatches);
    while( true ) {
      iWatch = (WatcherInotify *)
               std::
               map<long,_efsw::WatcherInotify_*,_std::less<long>,_std::allocator<std::pair<const_long,_efsw::WatcherInotify_*>_>_>
               ::end(&this->mWatches);
      bVar2 = std::operator!=(&local_38,(_Self *)&iWatch);
      if (!bVar2) break;
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_long,_efsw::WatcherInotify_*>_>::operator->
                         (&local_38);
      _Var3 = std::operator==(&(ppVar4->second->super_Watcher).Directory,fpath);
      if (_Var3) {
        bVar1 = true;
        break;
      }
      std::_Rb_tree_iterator<std::pair<const_long,_efsw::WatcherInotify_*>_>::operator++(&local_38);
    }
    Lock::~Lock((Lock *)&it);
    if (!bVar1) {
      addWatch(this,fpath,watch->Listener,(bool)(watch->Recursive & 1),
               (bool)(watch[1].field_0x58 & 1),(WatcherInotify *)watch,true);
    }
  }
  return;
}

Assistant:

void FileWatcherInotify::checkForNewWatcher( Watcher* watch, std::string fpath ) {
	FileSystem::dirAddSlashAtEnd( fpath );

	/// If the watcher is recursive, checks if the new file is a folder, and creates a watcher
	if ( watch->Recursive && FileSystem::isDirectory( fpath ) ) {
		bool found = false;

		{
			Lock lock( mWatchesLock );

			/// First check if exists
			for ( WatchMap::iterator it = mWatches.begin(); it != mWatches.end(); ++it ) {
				if ( it->second->Directory == fpath ) {
					found = true;
					break;
				}
			}
		}

		if ( !found ) {
			WatcherInotify* iWatch = static_cast<WatcherInotify*>( watch );
			addWatch( fpath, watch->Listener, watch->Recursive, iWatch->syntheticEvents,
					  static_cast<WatcherInotify*>( watch ), true );
		}
	}
}